

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O2

int util::variant::int_length(int x)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = 1;
  if (x != 0) {
    uVar1 = (ulong)(uint)-x;
    if (0 < x) {
      uVar1 = (ulong)(uint)x;
    }
    if (-1 < (int)uVar1) {
      uVar2 = (uint)x >> 0x1f;
      for (; (int)uVar1 != 0; uVar1 = uVar1 / 10) {
        uVar2 = uVar2 + 1;
      }
    }
  }
  return uVar2;
}

Assistant:

int variant::int_length(int x)
{
	int count = 0;

	if (x == 0)
		return 1;

	if (x < 0)
	{
		x = -x;
		++count;
	}

	if (x < 0)
	{
		return 1;
	}

	while (x > 0)
	{
		x /= 10;
		++count;
	}

	return count;
}